

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::ExpandRegistryValues(string *source,KeyWOW64 param_2)

{
  bool bVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string key;
  string reg;
  RegularExpression regEntry;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  string local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  undefined8 local_180;
  undefined1 *local_178;
  undefined8 local_170;
  undefined1 *local_168;
  undefined8 local_160;
  char *local_158;
  char local_150 [32];
  undefined8 local_130;
  undefined1 *local_128;
  undefined1 local_120 [32];
  RegularExpression local_100;
  
  local_100.regmust = (char *)0x0;
  local_100.program = (char *)0x0;
  local_100.progsize = 0;
  memset(&local_100,0,0xaa);
  cmsys::RegularExpression::compile(&local_100,"\\[(HKEY[^]]*)\\]");
  while( true ) {
    bVar1 = cmsys::RegularExpression::find
                      (&local_100,(source->_M_dataplus)._M_p,&local_100.regmatch);
    if (!bVar1) break;
    local_1d0 = &local_1c0;
    if (local_100.regmatch.startp[1] == (char *)0x0) {
      local_1c8 = 0;
      local_1c0 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,local_100.regmatch.startp[1],local_100.regmatch.endp[1]);
    }
    local_160 = 1;
    local_150[0] = '[';
    local_190._M_len = 1;
    local_130 = 1;
    local_120[0] = 0x5d;
    local_170 = 1;
    views._M_len = 3;
    views._M_array = &local_190;
    local_190._M_str = local_150;
    local_180 = local_1c8;
    local_178 = local_1d0;
    local_168 = local_120;
    local_158 = local_150;
    local_128 = local_120;
    cmCatViews_abi_cxx11_(&local_1b0,views);
    cmsys::SystemTools::ReplaceString(source,local_1b0._M_dataplus._M_p,"/registry");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  return;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = cmStrCat('[', key, ']');
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}